

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O1

spv_result_t
spvExtInstTableNameLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,char *name,spv_ext_inst_desc *pEntry)

{
  uint uVar1;
  spv_ext_inst_group_t *psVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  spv_ext_inst_desc psVar7;
  
  if (table == (spv_ext_inst_table)0x0) {
    return SPV_ERROR_INVALID_TABLE;
  }
  if (pEntry == (spv_ext_inst_desc *)0x0) {
    return SPV_ERROR_INVALID_POINTER;
  }
  uVar1 = table->count;
  if ((ulong)uVar1 != 0) {
    uVar5 = 0;
    do {
      psVar2 = table->groups;
      bVar3 = false;
      if (psVar2[uVar5].type == type) {
        uVar6 = (ulong)psVar2[uVar5].count;
        bVar3 = false;
        if (uVar6 != 0) {
          psVar7 = psVar2[uVar5].entries;
          do {
            iVar4 = strcmp(name,psVar7->name);
            if (iVar4 == 0) {
              *pEntry = psVar7;
              bVar3 = true;
              break;
            }
            psVar7 = psVar7 + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
      }
      if (bVar3) {
        return SPV_SUCCESS;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return SPV_ERROR_INVALID_LOOKUP;
}

Assistant:

spv_result_t spvExtInstTableNameLookup(const spv_ext_inst_table table,
                                       const spv_ext_inst_type_t type,
                                       const char* name,
                                       spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (!strcmp(name, entry.name)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}